

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

Layer * ncnn::create_layer(char *type)

{
  int index;
  Layer *pLVar1;
  
  index = layer_to_index(type);
  if (index != -1) {
    pLVar1 = create_layer(index);
    return pLVar1;
  }
  return (Layer *)0x0;
}

Assistant:

Layer* create_layer(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer(index);
}